

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void __thiscall
polyscope::Histogram::smoothCurve
          (Histogram *this,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *xVals,
          vector<double,_std::allocator<double>_> *yVals)

{
  undefined1 auVar1 [16];
  pointer paVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  size_t j;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  double dVar10;
  undefined1 auVar11 [16];
  allocator_type local_59;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> smoothedVals;
  undefined1 extraout_var [56];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&smoothedVals,
             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_59);
  pdVar4 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar8 = 0; uVar8 < (ulong)((long)pdVar5 - (long)pdVar4 >> 3); uVar8 = uVar8 + 1) {
    paVar2 = (xVals->
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (paVar2[uVar8]._M_elems[0] + paVar2[uVar8]._M_elems[1]) * 0.5;
    dVar10 = 0.0;
    lVar7 = 8;
    for (uVar6 = 0; uVar6 < (ulong)((long)pdVar5 - (long)pdVar4 >> 3); uVar6 = uVar6 + 1) {
      paVar2 = (xVals->
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar3 = (*(double *)((long)paVar2->_M_elems + lVar7 + -8) +
              *(double *)((long)paVar2->_M_elems + lVar7)) * -0.5 + local_50;
      local_58 = dVar10;
      auVar9._0_8_ = exp(dVar3 * dVar3 * -1000.0);
      auVar9._8_56_ = extraout_var;
      pdVar4 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_58;
      pdVar5 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x10;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar4[uVar6];
      auVar1 = vfmadd231sd_fma(auVar11,auVar9._0_16_,auVar1);
      dVar10 = auVar1._0_8_;
      local_58 = dVar10;
    }
    smoothedVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start[uVar8] = dVar10;
  }
  std::vector<double,_std::allocator<double>_>::operator=(yVals,&smoothedVals);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&smoothedVals.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Histogram::smoothCurve(std::vector<std::array<double, 2>>& xVals, std::vector<double>& yVals) {

  auto smoothFunc = [&](double x1, double x2) {
    // Tent
    // double radius = 0.1;
    // double val = (radius - std::abs(x1 - x2)) / radius;
    // return std::max(val, 0.0);

    // Gaussian
    double widthFactor = 1000;
    double dist = (x1 - x2);
    return std::exp(-dist * dist * widthFactor);

    // None
    // if(x1 == x2) return 1.0;
    // return 0.0;
  };

  std::vector<double> smoothedVals(yVals.size());
  for (size_t i = 0; i < yVals.size(); i++) {
    double bucketCi = 0.5 * (xVals[i][0] + xVals[i][1]);
    double sum = 0.0;
    for (size_t j = 0; j < yVals.size(); j++) {
      double bucketCj = 0.5 * (xVals[j][0] + xVals[j][1]);
      double weight = smoothFunc(bucketCi, bucketCj);
      sum += weight * yVals[j];
    }
    smoothedVals[i] = sum;
  }

  yVals = smoothedVals;
}